

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1387::run(TestCase1387 *this)

{
  StructDataBitCount *this_00;
  Reader value;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> value_00;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  undefined8 in_stack_fffffffffffffa30;
  Builder local_5c0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_5a8;
  Reader local_580;
  Builder local_550;
  undefined1 local_538 [8];
  Builder root2_1;
  MallocMessageBuilder builder2_2;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  Reader local_3f8;
  undefined1 local_3c8 [8];
  Builder root2;
  MallocMessageBuilder builder2_1;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  Reader local_288;
  undefined1 local_258 [8];
  MallocMessageBuilder builder2;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1387 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  builder2.moreSegments.builder.disposer = (ArrayDisposer *)auStack_128;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffa30;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffa30 >> 0x30);
  initTestMessage(builder_00);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_258,0x400,GROW_HEURISTICALLY);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_288,(Builder *)auStack_128);
  MessageBuilder::setRoot<capnproto_test::capnp::test::TestAllTypes::Reader>
            ((MessageBuilder *)local_258,&local_288);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&builder2_1.moreSegments.builder.disposer,(MessageBuilder *)local_258);
  builder_01._builder.capTable = (CapTableBuilder *)local_2a0;
  builder_01._builder.segment = (SegmentBuilder *)uStack_2a8;
  builder_01._builder.data = (void *)uStack_298;
  builder_01._builder.pointers = (WirePointer *)local_290;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffa30;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffa30 >> 0x30);
  checkTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_258);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root2._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_3c8,(MessageBuilder *)&root2._builder.dataSize);
  capnproto_test::capnp::test::TestAllTypes::Builder::operator_cast_to_Reader
            (&local_3f8,(Builder *)auStack_128);
  value._reader.capTable = local_3f8._reader.capTable;
  value._reader.segment = local_3f8._reader.segment;
  value._reader.data = local_3f8._reader.data;
  value._reader.pointers = local_3f8._reader.pointers;
  value._reader.dataSize = local_3f8._reader.dataSize;
  value._reader.pointerCount = local_3f8._reader.pointerCount;
  value._reader._38_2_ = local_3f8._reader._38_2_;
  value._reader.nestingLimit = local_3f8._reader.nestingLimit;
  value._reader._44_4_ = local_3f8._reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setStructField((Builder *)local_3c8,value);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)&builder2_2.moreSegments.builder.disposer,(Builder *)local_3c8);
  builder_02._builder.capTable = (CapTableBuilder *)local_410;
  builder_02._builder.segment = (SegmentBuilder *)uStack_418;
  builder_02._builder.data = (void *)uStack_408;
  builder_02._builder.pointers = (WirePointer *)local_400;
  builder_02._builder.dataSize = local_3f8._reader.nestingLimit;
  builder_02._builder.pointerCount = local_3f8._reader._44_2_;
  builder_02._builder._38_2_ = local_3f8._reader._46_2_;
  checkTestMessage(builder_02);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root2._builder.dataSize);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root2_1._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_538,(MessageBuilder *)&root2_1._builder.dataSize);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_550,(Builder *)local_538);
  capnproto_test::capnp::test::TestAllTypes::Builder::operator_cast_to_Reader
            (&local_580,(Builder *)auStack_128);
  value_00._reader.capTable = local_580._reader.capTable;
  value_00._reader.segment = local_580._reader.segment;
  value_00._reader.data = local_580._reader.data;
  value_00._reader.pointers = local_580._reader.pointers;
  value_00._reader.dataSize = local_580._reader.dataSize;
  value_00._reader.pointerCount = local_580._reader.pointerCount;
  value_00._reader._38_2_ = local_580._reader._38_2_;
  value_00._reader.nestingLimit = local_580._reader.nestingLimit;
  value_00._reader._44_4_ = local_580._reader._44_4_;
  AnyPointer::Builder::setAs<capnproto_test::capnp::test::TestAllTypes>(&local_550,value_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_5c0,(Builder *)local_538);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_5a8,&local_5c0);
  builder_03._builder.capTable = (CapTableBuilder *)local_5a8._builder.data;
  builder_03._builder.segment = (SegmentBuilder *)local_5a8._builder.capTable;
  builder_03._builder.data = local_5a8._builder.pointers;
  builder_03._builder.pointers = (WirePointer *)local_5a8._builder._32_8_;
  builder_03._builder.dataSize = local_580._reader.nestingLimit;
  builder_03._builder.pointerCount = local_580._reader._44_2_;
  builder_03._builder._38_2_ = local_580._reader._46_2_;
  checkTestMessage(builder_03);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root2_1._builder.dataSize);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, StructSetters) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  initTestMessage(root);

  {
    MallocMessageBuilder builder2;
    builder2.setRoot(root.asReader());
    checkTestMessage(builder2.getRoot<TestAllTypes>());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<TestAllTypes>();
    root2.setStructField(root);
    checkTestMessage(root2.getStructField());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<test::TestAnyPointer>();
    root2.getAnyPointerField().setAs<test::TestAllTypes>(root);
    checkTestMessage(root2.getAnyPointerField().getAs<test::TestAllTypes>());
  }
}